

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void AddWindowToDrawData(ImGuiWindow *window,int layer)

{
  int *piVar1;
  ImGuiViewportP *pIVar2;
  ImGuiWindow *window_00;
  long lVar3;
  
  pIVar2 = window->Viewport;
  piVar1 = &(GImGui->IO).MetricsRenderWindows;
  *piVar1 = *piVar1 + 1;
  if ((window->Flags & 0x20000000) != 0) {
    ImDrawListSplitter::Merge(&window->DrawList->_Splitter,window->DrawList);
  }
  AddDrawListToDrawData((pIVar2->DrawDataBuilder).Layers + (uint)layer,window->DrawList);
  if (0 < (window->DC).ChildWindows.Size) {
    lVar3 = 0;
    do {
      window_00 = (window->DC).ChildWindows.Data[lVar3];
      if ((window_00->Active == true) && (window_00->Hidden == false)) {
        AddWindowToDrawData(window_00,layer);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (window->DC).ChildWindows.Size);
  }
  return;
}

Assistant:

static void AddWindowToDrawData(ImGuiWindow* window, int layer)
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* viewport = window->Viewport;
    g.IO.MetricsRenderWindows++;
    if (window->Flags & ImGuiWindowFlags_DockNodeHost)
        window->DrawList->ChannelsMerge();
    AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[layer], window->DrawList);
    for (int i = 0; i < window->DC.ChildWindows.Size; i++)
    {
        ImGuiWindow* child = window->DC.ChildWindows[i];
        if (IsWindowActiveAndVisible(child)) // Clipped children may have been marked not active
            AddWindowToDrawData(child, layer);
    }
}